

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

int __thiscall libDAI::HAK::init(HAK *this,EVP_PKEY_CTX *ctx)

{
  RegionGraph *pRVar1;
  bool bVar2;
  pointer this_00;
  RegionGraph *pRVar3;
  HAK *this_01;
  Region *pRVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  R_nb_cit alpha_1;
  size_t beta;
  iterator alpha;
  Factor *in_stack_ffffffffffffff78;
  RegionGraph *in_stack_ffffffffffffff80;
  Factor *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  RegionGraph *local_30;
  TFactor<double> *local_28;
  TFactor<double> *local_20;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_18;
  EVP_PKEY_CTX *local_10;
  HAK *local_8;
  
  local_10 = ctx;
  local_8 = this;
  local_18._M_current =
       (TFactor<double> *)
       std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                 ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                  in_stack_ffffffffffffff78);
  while( true ) {
    local_20 = (TFactor<double> *)
               std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                         ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           *)in_stack_ffffffffffffff78);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar2) break;
    this_00 = __gnu_cxx::
              __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
              ::operator->(&local_18);
    TFactor<double>::vars(this_00);
    bVar2 = VarSet::operator&&((VarSet *)in_stack_ffffffffffffffc0._M_current,
                               (VarSet *)in_stack_ffffffffffffffb8._M_current);
    auVar6 = in_ZMM0._0_16_;
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
      ::operator->(&local_18);
      __gnu_cxx::
      __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
      ::operator->(&local_18);
      sVar5 = TFactor<double>::stateSpace((TFactor<double> *)0xb48cc3);
      auVar6 = vcvtusi2sd_avx512f(auVar6,sVar5);
      in_ZMM0 = ZEXT864((ulong)(1.0 / auVar6._0_8_));
      TFactor<double>::fill
                ((TFactor<double> *)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
    }
    local_28 = (TFactor<double> *)
               __gnu_cxx::
               __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator++((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                             *)in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  local_30 = (RegionGraph *)0x0;
  while( true ) {
    pRVar1 = local_30;
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    pRVar3 = (RegionGraph *)RegionGraph::nr_IRs((RegionGraph *)0xb48d1d);
    if (pRVar3 <= pRVar1) break;
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    RegionGraph::IR(in_stack_ffffffffffffff80,(long)in_stack_ffffffffffffff78);
    bVar2 = VarSet::operator&&((VarSet *)in_stack_ffffffffffffffc0._M_current,
                               (VarSet *)in_stack_ffffffffffffffb8._M_current);
    auVar6 = in_ZMM0._0_16_;
    if (bVar2) {
      this_01 = (HAK *)std::
                       vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
                       operator[](&this->_Qb,(size_type)local_30);
      (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
      pRVar4 = RegionGraph::IR(in_stack_ffffffffffffff80,(long)in_stack_ffffffffffffff78);
      sVar5 = VarSet::stateSpace(&pRVar4->super_VarSet);
      auVar6 = vcvtusi2sd_avx512f(auVar6,sVar5);
      in_ZMM0 = ZEXT864((ulong)(1.0 / auVar6._0_8_));
      TFactor<double>::fill
                ((TFactor<double> *)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
      (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
      RegionGraph::nbIR(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffffc0 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff78);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_ffffffffffffff80,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_ffffffffffffff78);
      while( true ) {
        (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        RegionGraph::nbIR(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
        in_stack_ffffffffffffffb8 =
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff78);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffff80,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffff78);
        auVar6 = in_ZMM0._0_16_;
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_38);
        in_stack_ffffffffffffff78 =
             muab(this_01,(size_t)in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
        (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        pRVar4 = RegionGraph::IR(in_stack_ffffffffffffff80,(long)in_stack_ffffffffffffff78);
        sVar5 = VarSet::stateSpace(&pRVar4->super_VarSet);
        auVar6 = vcvtusi2sd_avx512f(auVar6,sVar5);
        auVar6._0_8_ = 1.0 / auVar6._0_8_;
        auVar6._8_8_ = 0;
        TFactor<double>::fill
                  ((TFactor<double> *)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff80 = local_30;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_38);
        in_stack_ffffffffffffff88 =
             muba(this_01,(size_t)in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
        (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        pRVar4 = RegionGraph::IR(in_stack_ffffffffffffff80,(long)in_stack_ffffffffffffff78);
        sVar5 = VarSet::stateSpace(&pRVar4->super_VarSet);
        auVar6 = vcvtusi2sd_avx512f(auVar6,sVar5);
        in_ZMM0 = ZEXT864((ulong)(1.0 / auVar6._0_8_));
        TFactor<double>::fill
                  ((TFactor<double> *)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      }
    }
    local_30 = (RegionGraph *)((long)&(local_30->super_GraphicalModel)._vptr_GraphicalModel + 1);
  }
  return (int)pRVar1;
}

Assistant:

void HAK::init( const VarSet &ns ) {
        for( vector<Factor>::iterator alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
            if( alpha->vars() && ns )
                alpha->fill( 1.0 / alpha->stateSpace() );

        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            if( grm().IR(beta) && ns ) {
                _Qb[beta].fill( 1.0 / grm().IR(beta).stateSpace() );
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muab(*alpha,beta).fill( 1.0 / grm().IR(beta).stateSpace() );
                    muba(beta,*alpha).fill( 1.0 / grm().IR(beta).stateSpace() );
                }
            }
    }